

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O0

void __thiscall String::clear(String *this)

{
  uint64 uVar1;
  String *this_local;
  
  if (this->data->ref == 1) {
    this->data->len = 0;
    *this->data->str = '\0';
  }
  else {
    if (((this->data->ref != 0) && (uVar1 = Atomic::decrement(&this->data->ref), uVar1 == 0)) &&
       (this->data != (Data *)0x0)) {
      operator_delete__(this->data);
    }
    this->data = &emptyData.super_Data;
  }
  return;
}

Assistant:

void clear()
  {
    if(data->ref == 1)
    {
      data->len = 0;
      *(char*)data->str = '\0';
    }
    else
    {
      if(data->ref && Atomic::decrement(data->ref) == 0)
        delete[] (char*)data;

      data = &emptyData;
    }
  }